

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::FindNextLowestFloor(sector_t *this,vertex_t **v)

{
  line_t_conflict *plVar1;
  double dVar2;
  bool bVar3;
  vertex_t *pvVar4;
  long lVar5;
  sector_t_conflict *other;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (this->linecount == 0) {
    dVar6 = this->planes[0].TexZ;
  }
  else {
    pvVar4 = (*this->lines)->v1;
    dVar6 = ((pvVar4->p).Y * (this->floorplane).normal.Y +
            (this->floorplane).D + (pvVar4->p).X * (this->floorplane).normal.X) *
            (this->floorplane).negiC;
    if (0 < this->linecount) {
      dVar9 = 3.4028234663852886e+38;
      lVar5 = 0;
      do {
        plVar1 = this->lines[lVar5];
        if (((plVar1->flags & 4) != 0) &&
           (((other = plVar1->frontsector, other != (sector_t_conflict *)this ||
             (other = plVar1->backsector, other != (sector_t_conflict *)this)) &&
            (other != (sector_t_conflict *)0x0)))) {
          dVar8 = (plVar1->v1->p).X;
          dVar2 = (plVar1->v1->p).Y;
          dVar7 = (other->floorplane).negiC *
                  ((other->floorplane).normal.Y * dVar2 +
                  (other->floorplane).normal.X * dVar8 + (other->floorplane).D);
          dVar8 = (this->floorplane).negiC *
                  ((this->floorplane).normal.Y * dVar2 +
                  (this->floorplane).normal.X * dVar8 + (this->floorplane).D);
          if ((dVar7 < dVar8) && (dVar8 = dVar8 - dVar7, dVar8 < dVar9)) {
            bVar3 = IsLinked(this,other,false);
            if (!bVar3) {
              pvVar4 = plVar1->v1;
              dVar6 = dVar7;
              dVar9 = dVar8;
            }
          }
          dVar8 = (plVar1->v2->p).X;
          dVar2 = (plVar1->v2->p).Y;
          dVar7 = (other->floorplane).negiC *
                  ((other->floorplane).normal.Y * dVar2 +
                  (other->floorplane).normal.X * dVar8 + (other->floorplane).D);
          dVar8 = (this->floorplane).negiC *
                  ((this->floorplane).normal.Y * dVar2 +
                  (this->floorplane).normal.X * dVar8 + (this->floorplane).D);
          if ((dVar7 < dVar8) && (dVar8 = dVar8 - dVar7, dVar8 < dVar9)) {
            bVar3 = IsLinked(this,other,false);
            if (!bVar3) {
              pvVar4 = plVar1->v2;
              dVar6 = dVar7;
              dVar9 = dVar8;
            }
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->linecount);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar4;
    }
  }
  return dVar6;
}

Assistant:

double sector_t::FindNextLowestFloor (vertex_t **v) const
{
	double height;
	double heightdiff;
	double ofloor, floor;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::floor);

	spot = lines[0]->v1;
	height = floorplane.ZatPoint (spot);
	heightdiff = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			ofloor = other->floorplane.ZatPoint (check->v1);
			floor = floorplane.ZatPoint (check->v1);
			if (ofloor < floor && floor - ofloor < heightdiff && !IsLinked(other, false))
			{
				heightdiff = floor - ofloor;
				height = ofloor;
				spot = check->v1;
			}
			ofloor = other->floorplane.ZatPoint (check->v2);
			floor = floorplane.ZatPoint(check->v2);
			if (ofloor < floor && floor - ofloor < heightdiff && !IsLinked(other, false))
			{
				heightdiff = floor - ofloor;
				height = ofloor;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}